

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_key_value_api_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_270eb7::BaseKeyValAPI::TearDown(BaseKeyValAPI *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  Message local_30;
  internal local_28 [8];
  undefined8 *local_20;
  
  local_30.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_38.data_._0_4_ = aom_codec_destroy(&this->enc_);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            (local_28,"AOM_CODEC_OK","aom_codec_destroy(&enc_)",(aom_codec_err_t *)&local_30,
             (aom_codec_err_t *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_20 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_key_value_api_test.cc"
               ,0x34,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_38,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_30.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_30.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_30.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = local_20;
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(puVar1);
  }
  local_30.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_38.data_._0_4_ = aom_codec_destroy(&this->dec_);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            (local_28,"AOM_CODEC_OK","aom_codec_destroy(&dec_)",(aom_codec_err_t *)&local_30,
             (aom_codec_err_t *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_20 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_key_value_api_test.cc"
               ,0x37,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_38,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_30.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_30.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_30.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_30.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  return;
}

Assistant:

void TearDown() override {
#if CONFIG_AV1_ENCODER
    EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc_));
#endif
#if CONFIG_AV1_DECODER
    EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&dec_));
#endif
  }